

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# japancal.cpp
# Opt level: O0

int32_t __thiscall
icu_63::JapaneseCalendar::getActualMaximum
          (JapaneseCalendar *this,UCalendarDateFields field,UErrorCode *status)

{
  UBool UVar1;
  int32_t iVar2;
  int local_4c;
  int32_t maxYear;
  int32_t eraStartYear;
  int32_t nextEraDate;
  int32_t nextEraMonth;
  int32_t nextEraYear;
  int32_t nextEraStart [3];
  int32_t era;
  UErrorCode *status_local;
  UCalendarDateFields field_local;
  JapaneseCalendar *this_local;
  
  unique0x100000fa = status;
  if (field == UCAL_YEAR) {
    nextEraStart[1] = Calendar::get((Calendar *)this,UCAL_ERA,status);
    UVar1 = ::U_FAILURE(*stack0xffffffffffffffd8);
    if (UVar1 == '\0') {
      if (nextEraStart[1] == gCurrentEra) {
        this_local._4_4_ =
             (*(this->super_GregorianCalendar).super_Calendar.super_UObject._vptr_UObject[0x1f])
                       (this,1,3);
      }
      else {
        memset(&nextEraMonth,0,0xc);
        EraRules::getStartDate
                  (gJapaneseEraRules,nextEraStart[1] + 1,(int32_t (*) [3])&nextEraMonth,
                   stack0xffffffffffffffd8);
        iVar2 = EraRules::getStartYear(gJapaneseEraRules,nextEraStart[1],stack0xffffffffffffffd8);
        local_4c = (nextEraMonth - iVar2) + 1;
        if ((nextEraYear == 1) && (nextEraStart[0] == 1)) {
          local_4c = nextEraMonth - iVar2;
        }
        this_local._4_4_ = local_4c;
      }
    }
    else {
      this_local._4_4_ = 0;
    }
  }
  else {
    this_local._4_4_ =
         GregorianCalendar::getActualMaximum(&this->super_GregorianCalendar,field,status);
  }
  return this_local._4_4_;
}

Assistant:

int32_t JapaneseCalendar::getActualMaximum(UCalendarDateFields field, UErrorCode& status) const {
    if (field == UCAL_YEAR) {
        int32_t era = get(UCAL_ERA, status);
        if (U_FAILURE(status)) {
            return 0; // error case... any value
        }
        if (era == gCurrentEra) {
            // TODO: Investigate what value should be used here - revisit after 4.0.
            return handleGetLimit(UCAL_YEAR, UCAL_LIMIT_MAXIMUM);
        } else {
            int32_t nextEraStart[3] = { 0,0,0 };
            gJapaneseEraRules->getStartDate(era + 1, nextEraStart, status);
            int32_t nextEraYear = nextEraStart[0];
            int32_t nextEraMonth = nextEraStart[1]; // 1-base
            int32_t nextEraDate = nextEraStart[2];

            int32_t eraStartYear = gJapaneseEraRules->getStartYear(era, status);
            int32_t maxYear = nextEraYear - eraStartYear + 1;   // 1-base
            if (nextEraMonth == 1 && nextEraDate == 1) {
                // Subtract 1, because the next era starts at Jan 1
                maxYear--;
            }
            return maxYear;
        }
    }
    return GregorianCalendar::getActualMaximum(field, status);
}